

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.h
# Opt level: O0

void __thiscall spvtools::opt::InstructionList::~InstructionList(InstructionList *this)

{
  InstructionList *this_local;
  
  (this->super_IntrusiveList<spvtools::opt::Instruction>)._vptr_IntrusiveList =
       (_func_int **)&PTR__InstructionList_010e5980;
  clear(this);
  utils::IntrusiveList<spvtools::opt::Instruction>::~IntrusiveList
            (&this->super_IntrusiveList<spvtools::opt::Instruction>);
  return;
}

Assistant:

InstructionList::~InstructionList() { clear(); }